

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
::
insert<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
                 table,size_t pos,StringPtr *params)

{
  size_t *psVar1;
  uint uVar2;
  Disposer *pDVar3;
  Vat *pVVar4;
  uchar *__s2;
  size_t __n;
  uint uVar5;
  int iVar6;
  long lVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar9;
  Entry *this_00;
  ArrayPtr<const_unsigned_char> *in_R9;
  uint uVar10;
  Vat *pVVar11;
  HashBucket *_s944;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar12;
  Maybe<unsigned_long> MVar13;
  
  this_00 = table.ptr;
  if ((ulong)((long)(this_00->value).ptr * 2) < ((this_00->key).content.size_ + pos) * 3 + 3) {
    HashIndex<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
    ::rehash((HashIndex<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
              *)this_00,pos * 3 + 3);
  }
  uVar5 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,*in_R9);
  pDVar3 = (this_00->value).disposer;
  pVVar4 = (this_00->value).ptr;
  __s2 = in_R9->ptr;
  __n = in_R9->size_;
  paVar12 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  uVar10 = (int)pVVar4 - 1U & uVar5;
  do {
    paVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pDVar3 + uVar10);
    uVar2 = *(uint *)((long)paVar8 + 4);
    if (uVar2 == 1) {
      if (paVar12 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar12 = paVar8;
      }
    }
    else {
      if (uVar2 == 0) {
        if (paVar12 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          psVar1 = &(this_00->key).content.size_;
          *psVar1 = *psVar1 - 1;
          paVar8 = paVar12;
        }
        aVar9.value = ((ulong)uVar5 | (long)params << 0x20) + 0x200000000;
        paVar8->value = (unsigned_long)aVar9;
        *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
                 )0x0;
        goto LAB_0033f427;
      }
      if (*(uint *)paVar8 == uVar5) {
        lVar7 = (ulong)(uVar2 - 2) * 0x38;
        if ((*(size_t *)(table.size_ + 8 + lVar7) == __n) &&
           ((__n == 0 || (iVar6 = bcmp(*(void **)(table.size_ + lVar7),__s2,__n), iVar6 == 0)))) {
          aVar9.value = 0;
          *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
LAB_0033f427:
          MVar13.ptr.field_1.value = aVar9.value;
          MVar13.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar13.ptr;
        }
      }
    }
    pVVar11 = (Vat *)((ulong)uVar10 + 1);
    uVar10 = (uint)pVVar11;
    if (pVVar11 == pVVar4) {
      uVar10 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }